

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_himawari8.cc
# Opt level: O0

string * __thiscall
Himawari8ImageHandler::getBasename_abi_cxx11_(Himawari8ImageHandler *this,File *f)

{
  runtime_error *this_00;
  string *in_RDI;
  size_t pos;
  string text;
  char (*in_stack_000000d0) [107];
  char (*in_stack_000000d8) [48];
  File *in_stack_ffffffffffffff28;
  string *in;
  string local_98 [48];
  size_t local_68;
  string local_58 [32];
  string local_38 [56];
  
  in = in_RDI;
  lrit::File::getHeader<lrit::AnnotationHeader>(in_stack_ffffffffffffff28);
  std::__cxx11::string::string(local_38,local_58);
  lrit::AnnotationHeader::~AnnotationHeader((AnnotationHeader *)0x2a7f47);
  local_68 = util::findLast(in,(char)((ulong)in_RDI >> 0x38));
  if (local_68 == 0xffffffffffffffff) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[48],char[107],char[2],int>
              (in_stack_000000d8,in_stack_000000d0,(char (*) [2])this,(int *)f);
    std::runtime_error::runtime_error(this_00,local_98);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_38);
  std::__cxx11::string::~string(local_38);
  return in;
}

Assistant:

std::string Himawari8ImageHandler::getBasename(const lrit::File& f) const {
  auto text = f.getHeader<lrit::AnnotationHeader>().text;

  // Find last _ in annotation text and use this prefix
  // as identification for this segmented image.
  // Example annotation: IMG_DK01VIS_201712162250_003.lrit
  auto pos = findLast(text, '_');
  ASSERT(pos != std::string::npos);
  return text.substr(0, pos);
}